

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O3

void __thiscall
uttamarin::App::PrintFooter
          (App *this,int true_lemmas,int false_lemmas,int unknown_lemmas,int overall_duration)

{
  pointer ppbVar1;
  OutputWriter *pOVar2;
  int duration;
  pointer ppbVar3;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2_1;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2_2;
  string local_50;
  
  pOVar2 = OutputWriter::operator<<
                     ((this->output_writer_).
                      super___shared_ptr<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      ,"\n");
  pOVar2 = OutputWriter::operator<<(pOVar2,"Summary: ");
  pOVar2 = OutputWriter::operator<<(pOVar2,"\n");
  pOVar2 = OutputWriter::operator<<(pOVar2,"verified: ");
  ppbVar1 = (pOVar2->streams_).
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppbVar3 = (pOVar2->streams_).
                 super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppbVar3 != ppbVar1;
      ppbVar3 = ppbVar3 + 1) {
    std::ostream::operator<<((ostream *)*ppbVar3,true_lemmas);
  }
  pOVar2 = OutputWriter::operator<<(pOVar2,", false: ");
  ppbVar1 = (pOVar2->streams_).
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppbVar3 = (pOVar2->streams_).
                 super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppbVar3 != ppbVar1;
      ppbVar3 = ppbVar3 + 1) {
    std::ostream::operator<<((ostream *)*ppbVar3,false_lemmas);
  }
  pOVar2 = OutputWriter::operator<<(pOVar2,", timeout: ");
  ppbVar1 = (pOVar2->streams_).
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppbVar3 = (pOVar2->streams_).
                 super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppbVar3 != ppbVar1;
      ppbVar3 = ppbVar3 + 1) {
    std::ostream::operator<<((ostream *)*ppbVar3,unknown_lemmas);
  }
  pOVar2 = OutputWriter::operator<<(pOVar2,"\n");
  pOVar2 = OutputWriter::operator<<(pOVar2,"Overall duration: ");
  ToSecondsString_abi_cxx11_(&local_50,(uttamarin *)(ulong)(uint)overall_duration,duration);
  ppbVar1 = (pOVar2->streams_).
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppbVar3 = (pOVar2->streams_).
                 super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppbVar3 != ppbVar1;
      ppbVar3 = ppbVar3 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (*ppbVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  OutputWriter::Endl((this->output_writer_).
                     super___shared_ptr<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  return;
}

Assistant:

void App::PrintFooter(int true_lemmas, int false_lemmas,
                      int unknown_lemmas, int overall_duration) {
  *output_writer_ << "\n"
    << "Summary: " << "\n"
    << "verified: " << true_lemmas
    << ", false: " << false_lemmas
    << ", timeout: " << unknown_lemmas
    << "\n"
    << "Overall duration: " << ToSecondsString(overall_duration);
  output_writer_->Endl();
}